

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O2

void update_txk_array(MACROBLOCKD *xd,int blk_row,int blk_col,TX_SIZE tx_size,TX_TYPE tx_type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000009;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  iVar1 = xd->tx_type_map_stride;
  xd->tx_type_map[iVar1 * blk_row + blk_col] = tx_type;
  uVar7 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_size) * 4);
  iVar2 = *(int *)((long)tx_size_wide_unit + uVar7);
  iVar3 = *(int *)((long)tx_size_high_unit + uVar7);
  if (((0x41010UL >> ((ulong)tx_size & 0x3f) & 1) != 0) ||
     ((0x20810UL >> ((ulong)tx_size & 0x3f) & 1) != 0)) {
    lVar4 = (long)blk_row * (long)iVar1 + (long)blk_col;
    for (lVar5 = 0; lVar5 < iVar3; lVar5 = lVar5 + 4) {
      for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 4) {
        xd->tx_type_map[lVar6 + lVar4] = tx_type;
      }
      lVar4 = lVar4 + (long)iVar1 * 4;
    }
  }
  return;
}

Assistant:

static inline void update_txk_array(MACROBLOCKD *const xd, int blk_row,
                                    int blk_col, TX_SIZE tx_size,
                                    TX_TYPE tx_type) {
  const int stride = xd->tx_type_map_stride;
  xd->tx_type_map[blk_row * stride + blk_col] = tx_type;

  const int txw = tx_size_wide_unit[tx_size];
  const int txh = tx_size_high_unit[tx_size];
  // The 16x16 unit is due to the constraint from tx_64x64 which sets the
  // maximum tx size for chroma as 32x32. Coupled with 4x1 transform block
  // size, the constraint takes effect in 32x16 / 16x32 size too. To solve
  // the intricacy, cover all the 16x16 units inside a 64 level transform.
  if (txw == tx_size_wide_unit[TX_64X64] ||
      txh == tx_size_high_unit[TX_64X64]) {
    const int tx_unit = tx_size_wide_unit[TX_16X16];
    for (int idy = 0; idy < txh; idy += tx_unit) {
      for (int idx = 0; idx < txw; idx += tx_unit) {
        xd->tx_type_map[(blk_row + idy) * stride + blk_col + idx] = tx_type;
      }
    }
  }
}